

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * duckdb_fmt::v6::internal::
          parse_arg_id<wchar_t,duckdb_fmt::v6::internal::width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  wchar_t wVar2;
  int id;
  long lVar3;
  wchar_t *pwVar4;
  basic_string_view<wchar_t> id_00;
  allocator local_69;
  wchar_t *begin_local;
  string local_60;
  string local_40;
  
  wVar2 = *begin;
  pwVar4 = begin;
  begin_local = begin;
  if ((wVar2 == L'}') || (wVar2 == L':')) {
    width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
    ::operator()(handler);
  }
  else if ((uint)(wVar2 + L'\xffffffd0') < 10) {
    id = parse_nonnegative_int<wchar_t,duckdb_fmt::v6::internal::width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&,wchar_t>&>
                   (&begin_local,end,handler);
    if ((begin_local == end) || ((*begin_local != L':' && (*begin_local != L'}')))) {
      std::__cxx11::string::string((string *)&local_40,"invalid format string",&local_69);
      width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
      ::on_error(handler,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      pwVar4 = begin_local;
    }
    else {
      width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
      ::operator()(handler,id);
      pwVar4 = begin_local;
    }
  }
  else if ((wVar2 == L'_') || ((uint)((wVar2 & 0xffffffdfU) - 0x41U) < 0x1a)) {
    lVar1 = 4;
    do {
      lVar3 = lVar1;
      pwVar4 = (wchar_t *)((long)begin + lVar3);
      if (pwVar4 == end) break;
      wVar2 = *pwVar4;
      lVar1 = lVar3 + 4;
    } while ((((uint)(wVar2 + L'\xffffffd0') < 10) || (wVar2 == L'_')) ||
            ((uint)((wVar2 & 0xffffffdfU) - 0x41U) < 0x1a));
    id_00.size_ = lVar3 >> 2;
    id_00.data_ = begin;
    width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
    ::operator()(handler,id_00);
  }
  else {
    std::__cxx11::string::string((string *)&local_60,"invalid format string",&local_69);
    width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
    ::on_error(handler,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return pwVar4;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}